

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createMaterial_hair(SemanticParser *this,SP *in)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  float fVar7;
  undefined1 auVar8 [16];
  SP SVar9;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  SemanticParser *local_c8;
  string local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_c8 = this;
  std::__shared_ptr<pbrt::HairMaterial,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::HairMaterial>,std::__cxx11::string&>
            ((__shared_ptr<pbrt::HairMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             (allocator<pbrt::HairMaterial> *)&local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  p_Var6 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  p_Var5 = (_Rb_tree_node_base *)(*in_RDX + 8);
  _Var4._M_pi = extraout_RDX;
  if (p_Var6 != p_Var5) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_a0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var6 + 1));
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_a0.first._M_dataplus._M_p,
                 local_a0.first._M_dataplus._M_p + local_a0.first._M_string_length);
      iVar1 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar1 == 0) {
        fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_c0,0.0);
        *(float *)&(local_d8->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi = fVar7;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar1 == 0) {
          fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_c0,0.0);
          *(float *)&(local_d8->sampler).
                     super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = fVar7;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar1 == 0) {
            fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&local_c0,0.0);
            *(float *)((long)&(local_d8->film).
                              super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi + 4) = fVar7;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar1 != 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_70,"as-yet-unhandled hair-material parameter \'",&local_a0.first
                            );
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
              local_50 = (long *)*plVar2;
              plVar3 = plVar2 + 2;
              if (local_50 == plVar3) {
                local_40 = *plVar3;
                lStack_38 = plVar2[3];
                local_50 = &local_40;
              }
              else {
                local_40 = *plVar3;
              }
              local_48 = plVar2[1];
              *plVar2 = (long)plVar3;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              std::runtime_error::runtime_error(this_00,(string *)&local_50);
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_a0.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
        operator_delete(local_a0.first._M_dataplus._M_p,
                        local_a0.first.field_2._M_allocated_capacity + 1);
      }
      auVar8 = std::_Rb_tree_increment(p_Var6);
      _Var4._M_pi = auVar8._8_8_;
      p_Var6 = auVar8._0_8_;
    } while (p_Var6 != p_Var5);
  }
  (local_c8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  (local_c8->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_d0;
  SVar9.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  SVar9.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8;
  return (SP)SVar9.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_hair(pbrt::syntactic::Material::SP in)
  {
    HairMaterial::SP mat = std::make_shared<HairMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "eumelanin") {
        mat->eumelanin = in->getParam1f(name);
      } else if (name == "alpha") {
        mat->alpha = in->getParam1f(name);
      } else if (name == "beta_m") {
        mat->beta_m = in->getParam1f(name);
      } else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("as-yet-unhandled hair-material parameter '"+it.first+"'");
    };
    return mat;
  }